

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O2

void __thiscall pbrt::Shape::readFrom(Shape *this,BinaryReader *binary)

{
  char cVar1;
  
  BinaryReader::read<pbrt::Material>(binary,&this->material);
  BinaryReader::read<std::__cxx11::string,std::shared_ptr<pbrt::Texture>>(binary,&this->textures);
  BinaryReader::read<pbrt::AreaLight>(binary,&this->areaLight);
  cVar1 = BinaryReader::read<signed_char>(binary);
  this->reverseOrientation = cVar1 != '\0';
  BinaryReader::read<float,void>(binary,&this->alpha);
  return;
}

Assistant:

void Shape::readFrom(BinaryReader &binary) 
  {
    binary.read(material);
    binary.read(textures);
    binary.read(areaLight);
    reverseOrientation = binary.read<int8_t>();
    binary.read(alpha);
  }